

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O0

int __thiscall
glcts::TextureCubeMapArraySamplingTest::bufferDefinition::bind
          (bufferDefinition *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  GLenum err;
  int extraout_EAX;
  InternalError *this_00;
  GLuint index_local;
  GLenum target_local;
  bufferDefinition *this_local;
  
  if (this->m_buffer_object_id == 0xffffffff) {
    this_00 = (InternalError *)__cxa_allocate_exception(0x38);
    tcu::InternalError::InternalError
              (this_00,"Invalid buffer object id used","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySampling.cpp"
               ,0x103d);
    __cxa_throw(this_00,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
  }
  (*this->m_gl->bindBufferBase)(__fd,(GLuint)__addr,this->m_buffer_object_id);
  err = (*this->m_gl->getError)();
  glu::checkError(err,"Failed to bind buffer.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySampling.cpp"
                  ,0x1041);
  return extraout_EAX;
}

Assistant:

void TextureCubeMapArraySamplingTest::bufferDefinition::bind(glw::GLenum target, glw::GLuint index) const
{
	if (m_invalid_buffer_object_id == m_buffer_object_id)
	{
		throw tcu::InternalError("Invalid buffer object id used", "", __FILE__, __LINE__);
	}

	m_gl->bindBufferBase(target, index, m_buffer_object_id);
	GLU_EXPECT_NO_ERROR(m_gl->getError(), "Failed to bind buffer.");
}